

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

SelectionFlags __thiscall
QAbstractItemView::selectionCommand(QAbstractItemView *this,QModelIndex *index,QEvent *event)

{
  bool bVar1;
  undefined1 uVar2;
  Int IVar3;
  QAbstractItemViewPrivate *event_00;
  QItemSelectionModel *pQVar4;
  QModelIndex *in_RDX;
  QAbstractItemViewPrivate *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *unaff_retaddr;
  QAbstractItemViewPrivate *in_stack_00000008;
  QAbstractItemViewPrivate *d;
  KeyboardModifiers keyModifiers;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_c;
  QEvent *event_01;
  
  event_01 = *(QEvent **)(in_FS_OFFSET + 0x28);
  event_00 = d_func((QAbstractItemView *)0x8104ff);
  if ((in_RDX == (QModelIndex *)0x0) || (bVar1 = QEvent::isInputEvent((QEvent *)in_RDX), !bVar1)) {
    QFlags<Qt::KeyboardModifier>::QFlags
              ((QFlags<Qt::KeyboardModifier> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac.i);
  }
  else {
    QInputEvent::modifiers
              ((QInputEvent *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  switch(event_00->selectionMode) {
  case NoSelection:
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac.i);
    break;
  case SingleSelection:
    if (in_RDX != (QModelIndex *)0x0) {
      in_stack_ffffffffffffffb4 = QEvent::type((QEvent *)in_RDX);
      if (in_stack_ffffffffffffffb4 == MouseButtonPress) {
        if ((event_00->pressedAlreadySelected & 1U) != 0) {
          QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)
                     CONCAT44(2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac.i);
          break;
        }
      }
      else {
        if (in_stack_ffffffffffffffb4 == MouseButtonRelease) {
          bVar1 = QModelIndex::isValid((QModelIndex *)CONCAT44(3,in_stack_ffffffffffffffb0));
          if (!bVar1) {
            QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                      ((QFlags<QItemSelectionModel::SelectionFlag> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac.i);
            break;
          }
        }
        else if (in_stack_ffffffffffffffb4 != KeyPress) goto LAB_00810685;
        QFlags<Qt::KeyboardModifier>::operator&
                  ((QFlags<Qt::KeyboardModifier> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac.i);
        IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffec);
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 & 0xffffff;
        if (IVar3 != 0) {
          pQVar4 = QPointer<QItemSelectionModel>::operator->
                             ((QPointer<QItemSelectionModel> *)0x81063f);
          uVar2 = QItemSelectionModel::isSelected((QModelIndex *)pQVar4);
          in_stack_ffffffffffffffb0 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffffb0);
        }
        if ((in_stack_ffffffffffffffb0 & 0x1000000) != 0) {
          QAbstractItemViewPrivate::selectionBehaviorFlags
                    ((QAbstractItemViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
               (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
               ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                                    in_stack_ffffffffffffffac.i);
          break;
        }
      }
    }
LAB_00810685:
    QAbstractItemViewPrivate::selectionBehaviorFlags
              ((QAbstractItemViewPrivate *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                              in_stack_ffffffffffffffac.i);
    break;
  case MultiSelection:
    local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QAbstractItemViewPrivate::multiSelectionCommand
                   ((QAbstractItemViewPrivate *)
                    CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),in_RDI,
                    (QEvent *)in_RSI);
    break;
  case ExtendedSelection:
    local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QAbstractItemViewPrivate::extendedSelectionCommand
                   (in_stack_00000008,unaff_retaddr,event_01);
    break;
  case ContiguousSelection:
    local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QAbstractItemViewPrivate::contiguousSelectionCommand(in_RSI,in_RDX,(QEvent *)event_00);
    break;
  default:
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac.i);
  }
  if (*(QEvent **)(in_FS_OFFSET + 0x28) != event_01) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
         (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
         local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i;
}

Assistant:

QItemSelectionModel::SelectionFlags QAbstractItemView::selectionCommand(const QModelIndex &index,
                                                                        const QEvent *event) const
{
    Q_D(const QAbstractItemView);
    Qt::KeyboardModifiers keyModifiers = event && event->isInputEvent()
                                       ? static_cast<const QInputEvent*>(event)->modifiers()
                                       : Qt::NoModifier;
    switch (d->selectionMode) {
        case NoSelection: // Never update selection model
            return QItemSelectionModel::NoUpdate;
        case SingleSelection: // ClearAndSelect on valid index otherwise NoUpdate
            if (event) {
                switch (event->type()) {
                case QEvent::MouseButtonPress:
                    // press with any modifiers on a selected item does nothing
                    if (d->pressedAlreadySelected)
                        return QItemSelectionModel::NoUpdate;
                    break;
                case QEvent::MouseButtonRelease:
                    // clicking into area with no items does nothing
                    if (!index.isValid())
                        return QItemSelectionModel::NoUpdate;
                    Q_FALLTHROUGH();
                case QEvent::KeyPress:
                    // ctrl-release on selected item deselects
                    if ((keyModifiers & Qt::ControlModifier) && d->selectionModel->isSelected(index))
                        return QItemSelectionModel::Deselect | d->selectionBehaviorFlags();
                    break;
                default:
                    break;
                }
            }
            return QItemSelectionModel::ClearAndSelect | d->selectionBehaviorFlags();
        case MultiSelection:
            return d->multiSelectionCommand(index, event);
        case ExtendedSelection:
            return d->extendedSelectionCommand(index, event);
        case ContiguousSelection:
            return d->contiguousSelectionCommand(index, event);
    }
    return QItemSelectionModel::NoUpdate;
}